

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O0

vector<wasm::Type,_std::allocator<wasm::Type>_> * __thiscall
wasm::TranslateToFuzzReader::recombine(wasm::Function*)::Scanner::getRelevantTypes(wasm::Type_
          (vector<wasm::Type,_std::allocator<wasm::Type>_> *__return_storage_ptr__,void *this,
          Type type)

{
  initializer_list<wasm::Type> __l;
  bool bVar1;
  iterator iVar2;
  iterator iVar3;
  HeapType *pHVar4;
  undefined1 extraout_DL;
  undefined1 extraout_DL_00;
  undefined7 uStack_117;
  value_type local_108;
  uintptr_t local_100;
  _Storage<wasm::HeapType,_true> local_f8;
  optional<wasm::HeapType> heapType;
  __normal_iterator<wasm::Type_*,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>_> local_c8;
  const_iterator local_c0;
  uintptr_t local_b8;
  undefined1 local_b0 [8];
  vector<wasm::Type,_std::allocator<wasm::Type>_> inexact;
  __normal_iterator<wasm::Type_*,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>_> local_80;
  const_iterator local_78;
  uintptr_t local_70;
  undefined1 local_68 [8];
  vector<wasm::Type,_std::allocator<wasm::Type>_> nullable;
  allocator<wasm::Type> local_39;
  Type local_38;
  iterator local_30;
  size_type local_28;
  void *local_20;
  Scanner *this_local;
  Type type_local;
  vector<wasm::Type,_std::allocator<wasm::Type>_> *ret;
  
  local_20 = this;
  this_local = (Scanner *)type.id;
  type_local.id = (uintptr_t)__return_storage_ptr__;
  bVar1 = Type::isRef((Type *)&this_local);
  if (bVar1) {
    nullable.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._3_1_ = 0;
    std::vector<wasm::Type,_std::allocator<wasm::Type>_>::vector(__return_storage_ptr__);
    std::vector<wasm::Type,_std::allocator<wasm::Type>_>::push_back
              (__return_storage_ptr__,(value_type *)&this_local);
    bVar1 = Type::isNonNullable((Type *)&this_local);
    if (bVar1) {
      local_70 = (uintptr_t)Type::with((Type *)&this_local,Nullable);
      Type_((vector<wasm::Type,_std::allocator<wasm::Type>_> *)local_68,this,(Type)local_70);
      local_80._M_current =
           (Type *)std::vector<wasm::Type,_std::allocator<wasm::Type>_>::end(__return_storage_ptr__)
      ;
      __gnu_cxx::
      __normal_iterator<wasm::Type_const*,std::vector<wasm::Type,std::allocator<wasm::Type>>>::
      __normal_iterator<wasm::Type*>
                ((__normal_iterator<wasm::Type_const*,std::vector<wasm::Type,std::allocator<wasm::Type>>>
                  *)&local_78,&local_80);
      iVar2 = std::vector<wasm::Type,_std::allocator<wasm::Type>_>::begin
                        ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)local_68);
      iVar3 = std::vector<wasm::Type,_std::allocator<wasm::Type>_>::end
                        ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)local_68);
      inexact.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)std::vector<wasm::Type,std::allocator<wasm::Type>>::
                    insert<__gnu_cxx::__normal_iterator<wasm::Type*,std::vector<wasm::Type,std::allocator<wasm::Type>>>,void>
                              ((vector<wasm::Type,std::allocator<wasm::Type>> *)
                               __return_storage_ptr__,local_78,
                               (__normal_iterator<wasm::Type_*,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>_>
                                )iVar2._M_current,
                               (__normal_iterator<wasm::Type_*,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>_>
                                )iVar3._M_current);
      std::vector<wasm::Type,_std::allocator<wasm::Type>_>::~vector
                ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)local_68);
    }
    bVar1 = Type::isExact((Type *)&this_local);
    if (bVar1) {
      local_b8 = (uintptr_t)Type::with((Type *)&this_local,Inexact);
      Type_((vector<wasm::Type,_std::allocator<wasm::Type>_> *)local_b0,this,(Type)local_b8);
      local_c8._M_current =
           (Type *)std::vector<wasm::Type,_std::allocator<wasm::Type>_>::end(__return_storage_ptr__)
      ;
      __gnu_cxx::
      __normal_iterator<wasm::Type_const*,std::vector<wasm::Type,std::allocator<wasm::Type>>>::
      __normal_iterator<wasm::Type*>
                ((__normal_iterator<wasm::Type_const*,std::vector<wasm::Type,std::allocator<wasm::Type>>>
                  *)&local_c0,&local_c8);
      iVar2 = std::vector<wasm::Type,_std::allocator<wasm::Type>_>::begin
                        ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)local_b0);
      iVar3 = std::vector<wasm::Type,_std::allocator<wasm::Type>_>::end
                        ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)local_b0);
      std::vector<wasm::Type,std::allocator<wasm::Type>>::
      insert<__gnu_cxx::__normal_iterator<wasm::Type*,std::vector<wasm::Type,std::allocator<wasm::Type>>>,void>
                ((vector<wasm::Type,std::allocator<wasm::Type>> *)__return_storage_ptr__,local_c0,
                 (__normal_iterator<wasm::Type_*,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>_>
                  )iVar2._M_current,
                 (__normal_iterator<wasm::Type_*,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>_>
                  )iVar3._M_current);
      nullable.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._3_1_ = 1;
      heapType.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::HeapType>._12_4_ = 1;
      std::vector<wasm::Type,_std::allocator<wasm::Type>_>::~vector
                ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)local_b0);
    }
    else {
      local_100 = (uintptr_t)Type::getHeapType((Type *)&this_local);
      local_f8 = (_Storage<wasm::HeapType,_true>)::wasm::HeapType::getSuperType();
      heapType.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::HeapType>._M_payload._M_value.id._0_1_ = extraout_DL;
      while (bVar1 = std::optional::operator_cast_to_bool((optional *)&local_f8._M_value), bVar1) {
        pHVar4 = std::optional<wasm::HeapType>::operator*
                           ((optional<wasm::HeapType> *)&local_f8._M_value);
        local_108.id = (uintptr_t)Type::with((Type *)&this_local,pHVar4->id);
        std::vector<wasm::Type,_std::allocator<wasm::Type>_>::push_back
                  (__return_storage_ptr__,&local_108);
        std::optional<wasm::HeapType>::operator->((optional<wasm::HeapType> *)&local_f8._M_value);
        local_f8 = (_Storage<wasm::HeapType,_true>)::wasm::HeapType::getSuperType();
        heapType.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::HeapType>._M_payload._M_value.id._1_7_ = uStack_117;
        heapType.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::HeapType>._M_payload._M_value.id._0_1_ = extraout_DL_00;
      }
      nullable.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._3_1_ = 1;
      heapType.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::HeapType>._12_4_ = 1;
    }
    if ((nullable.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage._3_1_ & 1) == 0) {
      std::vector<wasm::Type,_std::allocator<wasm::Type>_>::~vector(__return_storage_ptr__);
    }
  }
  else {
    local_38.id = (uintptr_t)this_local;
    local_30 = &local_38;
    local_28 = 1;
    std::allocator<wasm::Type>::allocator(&local_39);
    __l._M_len = local_28;
    __l._M_array = local_30;
    std::vector<wasm::Type,_std::allocator<wasm::Type>_>::vector
              (__return_storage_ptr__,__l,&local_39);
    std::allocator<wasm::Type>::~allocator(&local_39);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Type> getRelevantTypes(Type type) {
      // Given an expression of a type, we can replace not only other
      // expressions with the same type, but also supertypes - since then we'd
      // be replacing with a subtype, which is valid.
      if (!type.isRef()) {
        return {type};
      }

      std::vector<Type> ret;
      ret.push_back(type);

      if (type.isNonNullable()) {
        auto nullable = getRelevantTypes(type.with(Nullable));
        ret.insert(ret.end(), nullable.begin(), nullable.end());
      }
      if (type.isExact()) {
        auto inexact = getRelevantTypes(type.with(Inexact));
        ret.insert(ret.end(), inexact.begin(), inexact.end());
        // Do not consider exact references to supertypes.
        return ret;
      }

      for (auto heapType = type.getHeapType().getSuperType(); heapType;
           heapType = heapType->getSuperType()) {
        ret.push_back(type.with(*heapType));
      }

      return ret;
    }